

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::LabelTextV(char *label,char *fmt,__va_list_tag *args)

{
  float fVar1;
  bool bVar2;
  float fVar3;
  float _x;
  float fVar4;
  ImRect total_bb;
  ImRect value_bb;
  ImVec2 pos;
  ImVec2 label_size;
  ImVec2 value_size;
  char *value_text_end;
  char *value_text_begin;
  float w;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImVec2 *in_stack_fffffffffffffef8;
  ImRect *in_stack_ffffffffffffff00;
  __va_list_tag *in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  ImGuiItemFlags extra_flags;
  float in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  char **in_stack_ffffffffffffff20;
  ImVec2 *this;
  ImGuiID id;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  undefined4 uVar5;
  undefined4 uVar6;
  ImVec2 *this_00;
  undefined1 hide_text_after_hash;
  undefined4 in_stack_ffffffffffffff40;
  float fVar7;
  ImVec2 in_stack_ffffffffffffff48;
  ImVec2 in_stack_ffffffffffffff50;
  ImVec2 in_stack_ffffffffffffff60;
  ImVec2 local_98;
  ImRect local_90;
  ImVec2 local_80;
  ImVec2 local_78;
  ImRect local_70;
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  float local_34;
  ImGuiStyle *local_30;
  ImGuiContext *local_28;
  ImGuiWindow *local_20;
  
  local_20 = GetCurrentWindow();
  if ((local_20->SkipItems & 1U) == 0) {
    local_28 = GImGui;
    local_30 = &GImGui->Style;
    local_34 = CalcItemWidth();
    ImFormatStringToTempBufferV
              (in_stack_ffffffffffffff20,
               (char **)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
               in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    extra_flags = (ImGuiItemFlags)((ulong)in_stack_ffffffffffffff10 >> 0x20);
    uVar5 = 0;
    uVar6 = 0xbf800000;
    bVar2 = SUB41((uint)in_stack_ffffffffffffff1c >> 0x18,0);
    local_50 = CalcTextSize((char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                            (char *)in_stack_ffffffffffffff20,bVar2,in_stack_ffffffffffffff18);
    local_58 = CalcTextSize((char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                            (char *)in_stack_ffffffffffffff20,bVar2,in_stack_ffffffffffffff18);
    local_60 = (local_20->DC).CursorPos;
    fVar3 = (local_30->FramePadding).y;
    this_00 = &local_80;
    ImVec2::ImVec2(this_00,local_34,fVar3 + fVar3 + local_50.y);
    local_78 = ::operator+(in_stack_fffffffffffffef8,(ImVec2 *)0x4fab4b);
    ImRect::ImRect(&local_70,&local_60,&local_78);
    if (local_58.x <= 0.0) {
      fVar3 = 0.0;
    }
    else {
      fVar3 = (local_30->ItemInnerSpacing).x + local_58.x;
    }
    _x = local_34 + fVar3;
    fVar7 = local_34;
    fVar4 = ImMax<float>(local_50.y,local_58.y);
    fVar1 = (local_30->FramePadding).y;
    this = (ImVec2 *)&stack0xffffffffffffff60;
    ImVec2::ImVec2(this,_x,fVar1 + fVar1 + fVar4);
    id = (ImGuiID)((ulong)this >> 0x20);
    local_98 = ::operator+(in_stack_fffffffffffffef8,(ImVec2 *)0x4fac26);
    ImRect::ImRect(&local_90,&local_60,&local_98);
    ItemSize(in_stack_ffffffffffffff00,(float)((ulong)in_stack_fffffffffffffef8 >> 0x20));
    bVar2 = ItemAdd((ImRect *)CONCAT44(fVar3,in_stack_ffffffffffffff28),id,
                    (ImRect *)CONCAT44(_x,in_stack_ffffffffffffff18),extra_flags);
    if (bVar2) {
      ::operator+(in_stack_fffffffffffffef8,(ImVec2 *)0x4fac8e);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff50,0.0,0.0);
      RenderTextClipped((ImVec2 *)in_stack_ffffffffffffff50,(ImVec2 *)in_stack_ffffffffffffff48,
                        (char *)CONCAT44(fVar7,in_stack_ffffffffffffff40),(char *)this_00,
                        (ImVec2 *)CONCAT44(uVar6,uVar5),
                        (ImVec2 *)CONCAT44(fVar3,in_stack_ffffffffffffff28),
                        (ImRect *)in_stack_ffffffffffffff60);
      hide_text_after_hash = (undefined1)((ulong)this_00 >> 0x38);
      if (0.0 < local_58.x) {
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff48,
                       local_70.Max.x + (local_30->ItemInnerSpacing).x,
                       local_70.Min.y + (local_30->FramePadding).y);
        RenderText(in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48,
                   (char *)CONCAT44(fVar7,in_stack_ffffffffffffff40),(bool)hide_text_after_hash);
      }
    }
  }
  return;
}

Assistant:

void ImGui::LabelTextV(const char* label, const char* fmt, va_list args)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const float w = CalcItemWidth();

    const char* value_text_begin, *value_text_end;
    ImFormatStringToTempBufferV(&value_text_begin, &value_text_end, fmt, args);
    const ImVec2 value_size = CalcTextSize(value_text_begin, value_text_end, false);
    const ImVec2 label_size = CalcTextSize(label, NULL, true);

    const ImVec2 pos = window->DC.CursorPos;
    const ImRect value_bb(pos, pos + ImVec2(w, value_size.y + style.FramePadding.y * 2));
    const ImRect total_bb(pos, pos + ImVec2(w + (label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f), ImMax(value_size.y, label_size.y) + style.FramePadding.y * 2));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, 0))
        return;

    // Render
    RenderTextClipped(value_bb.Min + style.FramePadding, value_bb.Max, value_text_begin, value_text_end, &value_size, ImVec2(0.0f, 0.0f));
    if (label_size.x > 0.0f)
        RenderText(ImVec2(value_bb.Max.x + style.ItemInnerSpacing.x, value_bb.Min.y + style.FramePadding.y), label);
}